

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O0

void __thiscall
Opcode::AABBTreeCollider::_CollideBoxTri(AABBTreeCollider *this,AABBQuantizedNoLeafNode *b)

{
  uint uVar1;
  MeshInterface *pMVar2;
  bool bVar3;
  udword uVar4;
  int *piVar5;
  Point *pPVar6;
  Point *pPVar7;
  Point *pPVar8;
  Container *pCVar9;
  Point *pPVar10;
  Point *pPVar11;
  Point *pPVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float local_e44;
  float local_e40;
  float local_e3c;
  float local_e34;
  float local_e30;
  float local_e2c;
  float local_e24;
  float local_e20;
  float local_e1c;
  float local_e14;
  float local_e10;
  float local_e0c;
  float local_e04;
  float local_e00;
  float local_dfc;
  float local_df4;
  float local_df0;
  float local_dec;
  float local_dc8 [2];
  Point ea;
  Point Pa;
  QuantizedAABB *bb;
  AABBQuantizedNoLeafNode *b_local;
  AABBTreeCollider *this_local;
  float tmp_8;
  float tmp_7;
  float fex2;
  float tmp_6;
  float fez2;
  float fey2;
  Point e2;
  float tmp_5;
  float tmp_4;
  float fex1;
  float tmp_3;
  float fez1;
  float fey1;
  float tmp_2;
  float tmp_1;
  float fex0;
  float tmp;
  float fez0;
  float fey0;
  float max;
  float min;
  float rad;
  float local_cd0;
  float d;
  Point normal;
  Point e1;
  Point e0;
  Point v2;
  Point v1;
  Point v0;
  int local_c5c;
  VertexPointers VP_1;
  IndexedTriangle *T_1;
  float c_5;
  float c_4;
  float tmp_10;
  float isect2_1 [2];
  float isect1_1 [2];
  float xxyy_1;
  float yy_1;
  float xx_1;
  float y1_1;
  float y0_1;
  float f_1;
  float e_1;
  float d_2;
  float x1_1;
  float x0_1;
  float c_3;
  float b_2;
  float a_1;
  float up2_1;
  float up1_1;
  float up0_1;
  float vp2_1;
  float vp1_1;
  float vp0_1;
  float cc_1;
  float bb_2;
  short index_1;
  float max_2;
  Point D_1;
  float dv0dv2_1;
  float dv0dv1_1;
  float dv2_1;
  float dv1_1;
  float dv0_1;
  float d2_1;
  Point N2_1;
  float local_ac4;
  float fStack_ac0;
  float du0du2_1;
  float du0du1_1;
  float du2_1;
  float du1_1;
  float du0_1;
  undefined1 local_a90 [4];
  float d1_1;
  Point N1_1;
  float local_a78;
  float fStack_a74;
  Point E2_1;
  Point E1_1;
  int local_a24;
  VertexPointers VP;
  IndexedTriangle *T;
  float c_2;
  float c_1;
  float tmp_9;
  float isect2 [2];
  float isect1 [2];
  float xxyy;
  float yy;
  float xx;
  float y1;
  float y0;
  float f;
  float e;
  float d_1;
  float x1;
  float x0;
  float c;
  float b_1;
  float a;
  float up2;
  float up1;
  float up0;
  float vp2;
  float vp1;
  float vp0;
  float cc;
  float bb_1;
  short index;
  float max_1;
  Point D;
  float dv0dv2;
  float dv0dv1;
  float dv2;
  float dv1;
  float dv0;
  float d2;
  Point N2;
  float local_82c;
  float fStack_828;
  float du0du2;
  float du0du1;
  float du2;
  float du1;
  float du0;
  undefined1 local_7f8 [4];
  float d1;
  Point N1;
  float local_7e0;
  float fStack_7dc;
  Point E2;
  Point E1;
  int local_78c;
  uint local_e8;
  udword q;
  float local_d8 [2];
  Point vmax;
  Point vmin;
  
  ea.y = (float)(int)(b->mAABB).mCenter[0] * (this->mCenterCoeff0).x;
  ea.z = (float)(int)(b->mAABB).mCenter[1] * (this->mCenterCoeff0).y;
  fVar13 = (float)(int)(b->mAABB).mCenter[2] * (this->mCenterCoeff0).z;
  local_dc8[0] = (float)(b->mAABB).mExtents[0] * (this->mExtentsCoeff0).x;
  local_dc8[1] = (float)(b->mAABB).mExtents[1] * (this->mExtentsCoeff0).y;
  ea.x = (float)(b->mAABB).mExtents[2] * (this->mExtentsCoeff0).z;
  this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
  fVar14 = this->mLeafVerts[0].x - ea.y;
  fVar15 = this->mLeafVerts[1].x - ea.y;
  fVar16 = this->mLeafVerts[2].x - ea.y;
  if (fVar15 <= fVar14) {
    local_df4 = fVar16;
    if (fVar15 < fVar16) {
      local_df4 = fVar15;
    }
    local_df0 = local_df4;
  }
  else {
    local_dec = fVar16;
    if (fVar14 < fVar16) {
      local_dec = fVar14;
    }
    local_df0 = local_dec;
  }
  if (local_df0 <= local_dc8[0]) {
    if (fVar15 <= fVar14) {
      local_e04 = fVar14;
      if (fVar14 < fVar16) {
        local_e04 = fVar16;
      }
      local_e00 = local_e04;
    }
    else {
      local_dfc = fVar15;
      if (fVar15 < fVar16) {
        local_dfc = fVar16;
      }
      local_e00 = local_dfc;
    }
    if (-local_dc8[0] <= local_e00) {
      fVar17 = this->mLeafVerts[0].y - ea.z;
      fVar18 = this->mLeafVerts[1].y - ea.z;
      fVar19 = this->mLeafVerts[2].y - ea.z;
      if (fVar18 <= fVar17) {
        local_e14 = fVar19;
        if (fVar18 < fVar19) {
          local_e14 = fVar18;
        }
        local_e10 = local_e14;
      }
      else {
        local_e0c = fVar19;
        if (fVar17 < fVar19) {
          local_e0c = fVar17;
        }
        local_e10 = local_e0c;
      }
      if (local_e10 <= local_dc8[1]) {
        if (fVar18 <= fVar17) {
          local_e24 = fVar17;
          if (fVar17 < fVar19) {
            local_e24 = fVar19;
          }
          local_e20 = local_e24;
        }
        else {
          local_e1c = fVar18;
          if (fVar18 < fVar19) {
            local_e1c = fVar19;
          }
          local_e20 = local_e1c;
        }
        if (-local_dc8[1] <= local_e20) {
          fVar20 = this->mLeafVerts[0].z - fVar13;
          fVar21 = this->mLeafVerts[1].z - fVar13;
          fVar13 = this->mLeafVerts[2].z - fVar13;
          if (fVar21 <= fVar20) {
            local_e34 = fVar13;
            if (fVar21 < fVar13) {
              local_e34 = fVar21;
            }
            local_e30 = local_e34;
          }
          else {
            local_e2c = fVar13;
            if (fVar20 < fVar13) {
              local_e2c = fVar20;
            }
            local_e30 = local_e2c;
          }
          if (local_e30 <= ea.x) {
            if (fVar21 <= fVar20) {
              local_e44 = fVar20;
              if (fVar20 < fVar13) {
                local_e44 = fVar13;
              }
              local_e40 = local_e44;
            }
            else {
              local_e3c = fVar21;
              if (fVar21 < fVar13) {
                local_e3c = fVar13;
              }
              local_e40 = local_e3c;
            }
            if (-ea.x <= local_e40) {
              fVar27 = fVar15 - fVar14;
              fVar25 = fVar18 - fVar17;
              fVar22 = fVar21 - fVar20;
              fVar28 = fVar16 - fVar15;
              fVar26 = fVar19 - fVar18;
              fVar23 = fVar13 - fVar21;
              local_cd0 = fVar25 * fVar23 + -(fVar22 * fVar26);
              d = fVar22 * fVar28 + -(fVar27 * fVar23);
              normal.x = fVar27 * fVar26 + -(fVar25 * fVar28);
              fVar24 = -normal.x * fVar20 + -local_cd0 * fVar14 + -d * fVar17;
              for (local_e8 = 0; local_e8 < 3; local_e8 = local_e8 + 1) {
                if ((&local_cd0)[local_e8] <= 0.0) {
                  (&vmax.y)[local_e8] = local_dc8[local_e8];
                  local_d8[local_e8] = -local_dc8[local_e8];
                }
                else {
                  (&vmax.y)[local_e8] = -local_dc8[local_e8];
                  local_d8[local_e8] = local_dc8[local_e8];
                }
              }
              if (normal.x * vmin.x + local_cd0 * vmax.y + d * vmax.z + fVar24 <= 0.0) {
                if (normal.x * vmax.x + local_cd0 * local_d8[0] + d * local_d8[1] + fVar24 < 0.0) {
                  bVar3 = false;
                }
                else {
                  bVar3 = true;
                }
              }
              else {
                bVar3 = false;
              }
              if (bVar3) {
                if ((this->mFullPrimBoxTest & 1U) == 0) {
LAB_0028bf3c:
                  local_c5c = 1;
                }
                else {
                  fey0 = fVar22 * fVar17 + -(fVar25 * fVar20);
                  fVar24 = fVar22 * fVar19 + -(fVar25 * fVar13);
                  fez0 = fVar24;
                  if (fVar24 < fey0) {
                    fez0 = fey0;
                    fey0 = fVar24;
                  }
                  fVar24 = ABS(fVar22) * local_dc8[1] + ABS(fVar25) * ea.x;
                  if ((fVar24 < fey0) || (fez0 < -fVar24)) {
                    local_c5c = 0;
                  }
                  else {
                    fey0 = fVar27 * fVar20 + -(fVar22 * fVar14);
                    fVar24 = fVar27 * fVar13 + -(fVar22 * fVar16);
                    fez0 = fVar24;
                    if (fVar24 < fey0) {
                      fez0 = fey0;
                      fey0 = fVar24;
                    }
                    fVar22 = ABS(fVar22) * local_dc8[0] + ABS(fVar27) * ea.x;
                    if ((fVar22 < fey0) || (fez0 < -fVar22)) {
                      local_c5c = 0;
                    }
                    else {
                      fey0 = fVar25 * fVar15 + -(fVar27 * fVar18);
                      fVar22 = fVar25 * fVar16 + -(fVar27 * fVar19);
                      fez0 = fVar22;
                      if (fVar22 < fey0) {
                        fez0 = fey0;
                        fey0 = fVar22;
                      }
                      fVar22 = ABS(fVar25) * local_dc8[0] + ABS(fVar27) * local_dc8[1];
                      if ((fVar22 < fey0) || (fez0 < -fVar22)) {
                        local_c5c = 0;
                      }
                      else {
                        fey0 = fVar23 * fVar17 + -(fVar26 * fVar20);
                        fVar22 = fVar23 * fVar19 + -(fVar26 * fVar13);
                        fez0 = fVar22;
                        if (fVar22 < fey0) {
                          fez0 = fey0;
                          fey0 = fVar22;
                        }
                        fVar22 = ABS(fVar23) * local_dc8[1] + ABS(fVar26) * ea.x;
                        if ((fVar22 < fey0) || (fez0 < -fVar22)) {
                          local_c5c = 0;
                        }
                        else {
                          fey0 = fVar28 * fVar20 + -(fVar23 * fVar14);
                          fVar13 = fVar28 * fVar13 + -(fVar23 * fVar16);
                          fez0 = fVar13;
                          if (fVar13 < fey0) {
                            fez0 = fey0;
                            fey0 = fVar13;
                          }
                          fVar13 = ABS(fVar23) * local_dc8[0] + ABS(fVar28) * ea.x;
                          if ((fVar13 < fey0) || (fez0 < -fVar13)) {
                            local_c5c = 0;
                          }
                          else {
                            fey0 = fVar26 * fVar14 + -(fVar28 * fVar17);
                            fVar13 = fVar26 * fVar15 + -(fVar28 * fVar18);
                            fez0 = fVar13;
                            if (fVar13 < fey0) {
                              fez0 = fey0;
                              fey0 = fVar13;
                            }
                            fVar13 = ABS(fVar26) * local_dc8[0] + ABS(fVar28) * local_dc8[1];
                            if ((fVar13 < fey0) || (fez0 < -fVar13)) {
                              local_c5c = 0;
                            }
                            else {
                              fVar23 = this->mLeafVerts[0].x - this->mLeafVerts[2].x;
                              fVar22 = this->mLeafVerts[0].y - this->mLeafVerts[2].y;
                              fVar13 = this->mLeafVerts[0].z - this->mLeafVerts[2].z;
                              fey0 = fVar13 * fVar17 + -(fVar22 * fVar20);
                              fVar17 = fVar13 * fVar18 + -(fVar22 * fVar21);
                              fez0 = fVar17;
                              if (fVar17 < fey0) {
                                fez0 = fey0;
                                fey0 = fVar17;
                              }
                              fVar17 = ABS(fVar13) * local_dc8[1] + ABS(fVar22) * ea.x;
                              if ((fVar17 < fey0) || (fez0 < -fVar17)) {
                                local_c5c = 0;
                                bVar3 = true;
                              }
                              else {
                                fey0 = fVar23 * fVar20 + -(fVar13 * fVar14);
                                fVar14 = fVar23 * fVar21 + -(fVar13 * fVar15);
                                fez0 = fVar14;
                                if (fVar14 < fey0) {
                                  fez0 = fey0;
                                  fey0 = fVar14;
                                }
                                fVar14 = ABS(fVar13) * local_dc8[0] + ABS(fVar23) * ea.x;
                                if ((fVar14 < fey0) || (fez0 < -fVar14)) {
                                  local_c5c = 0;
                                  bVar3 = true;
                                }
                                else {
                                  fey0 = fVar22 * fVar15 + -(fVar23 * fVar18);
                                  fVar14 = fVar22 * fVar16 + -(fVar23 * fVar19);
                                  fez0 = fVar14;
                                  if (fVar14 < fey0) {
                                    fez0 = fey0;
                                    fey0 = fVar14;
                                  }
                                  fVar14 = ABS(fVar22) * local_dc8[0] + ABS(fVar23) * local_dc8[1];
                                  if ((fVar14 < fey0) || (fez0 < -fVar14)) {
                                    local_c5c = 0;
                                    bVar3 = true;
                                  }
                                  else {
                                    bVar3 = false;
                                  }
                                }
                              }
                              if (!bVar3) goto LAB_0028bf3c;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                local_c5c = 0;
              }
            }
            else {
              local_c5c = 0;
            }
          }
          else {
            local_c5c = 0;
          }
        }
        else {
          local_c5c = 0;
        }
      }
      else {
        local_c5c = 0;
      }
    }
    else {
      local_c5c = 0;
    }
  }
  else {
    local_c5c = 0;
  }
  if (local_c5c == 0) {
    return;
  }
  if ((b->mPosData & 1) == 0) {
    _CollideBoxTri(this,(AABBQuantizedNoLeafNode *)b->mPosData);
  }
  else {
    uVar4 = (udword)(b->mPosData >> 1);
    pMVar2 = this->mIMesh0;
    piVar5 = (int *)((long)pMVar2->mTris->mVRef + (ulong)(uVar4 * pMVar2->mTriStride));
    pPVar6 = (Point *)((long)&pMVar2->mVerts->x + (ulong)(*piVar5 * pMVar2->mVertexStride));
    pPVar7 = (Point *)((long)&pMVar2->mVerts->x + (ulong)(piVar5[1] * pMVar2->mVertexStride));
    pPVar8 = (Point *)((long)&pMVar2->mVerts->x + (ulong)(piVar5[2] * pMVar2->mVertexStride));
    pPVar12 = this->mLeafVerts;
    pPVar11 = this->mLeafVerts + 1;
    pPVar10 = this->mLeafVerts + 2;
    this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
    fVar14 = this->mLeafVerts[1].z - this->mLeafVerts[0].z;
    E2.y = pPVar11->x - pPVar12->x;
    E2.z = this->mLeafVerts[1].y - this->mLeafVerts[0].y;
    fVar15 = this->mLeafVerts[2].z - this->mLeafVerts[0].z;
    local_7e0 = pPVar10->x - pPVar12->x;
    fStack_7dc = this->mLeafVerts[2].y - this->mLeafVerts[0].y;
    E2.z = SUB84(E2._4_8_,4);
    fStack_7dc = SUB84(_local_7e0,4);
    local_7f8 = (undefined1  [4])(E2.z * fVar15 + -(fVar14 * fStack_7dc));
    local_7e0 = (float)_local_7e0;
    E2.y = (float)E2._4_8_;
    d1 = fVar14 * local_7e0 + -(E2.y * fVar15);
    N1.x = E2.y * fStack_7dc + -(E2.z * local_7e0);
    fVar14 = -N1.x * this->mLeafVerts[0].z +
             -(float)local_7f8 * pPVar12->x + -d1 * this->mLeafVerts[0].y;
    du2 = N1.x * pPVar6->z + (float)local_7f8 * pPVar6->x + d1 * pPVar6->y + fVar14;
    du0du1 = N1.x * pPVar7->z + (float)local_7f8 * pPVar7->x + d1 * pPVar7->y + fVar14;
    du0du2 = N1.x * pPVar8->z + (float)local_7f8 * pPVar8->x + d1 * pPVar8->y + fVar14;
    if (ABS(du2) < 1e-06) {
      du2 = 0.0;
    }
    if (ABS(du0du1) < 1e-06) {
      du0du1 = 0.0;
    }
    if (ABS(du0du2) < 1e-06) {
      du0du2 = 0.0;
    }
    if ((du2 * du0du1 <= 0.0) || (du2 * du0du2 <= 0.0)) {
      fVar14 = pPVar7->z - pPVar6->z;
      local_82c = pPVar7->x - pPVar6->x;
      fStack_828 = pPVar7->y - pPVar6->y;
      fVar15 = pPVar8->z - pPVar6->z;
      N2.y = pPVar8->x - pPVar6->x;
      N2.z = pPVar8->y - pPVar6->y;
      E2.z = (float)((ulong)_local_82c >> 0x20);
      fStack_7dc = SUB84(N2._4_8_,4);
      fVar13 = E2.z * fVar15 + -(fVar14 * fStack_7dc);
      local_7e0 = (float)N2._4_8_;
      E2.y = (float)_local_82c;
      fVar16 = fVar14 * local_7e0 + -(E2.y * fVar15);
      fVar14 = E2.y * fStack_7dc + -(E2.z * local_7e0);
      fVar15 = -fVar14 * pPVar6->z + -fVar13 * pPVar6->x + -fVar16 * pPVar6->y;
      dv2 = fVar14 * this->mLeafVerts[0].z + fVar13 * pPVar12->x + fVar16 * this->mLeafVerts[0].y +
            fVar15;
      dv0dv1 = fVar14 * this->mLeafVerts[1].z + fVar13 * pPVar11->x + fVar16 * this->mLeafVerts[1].y
               + fVar15;
      dv0dv2 = fVar14 * this->mLeafVerts[2].z + fVar13 * pPVar10->x + fVar16 * this->mLeafVerts[2].y
               + fVar15;
      if (ABS(dv2) < 1e-06) {
        dv2 = 0.0;
      }
      if (ABS(dv0dv1) < 1e-06) {
        dv0dv1 = 0.0;
      }
      if (ABS(dv0dv2) < 1e-06) {
        dv0dv2 = 0.0;
      }
      if ((dv2 * dv0dv1 <= 0.0) || (dv2 * dv0dv2 <= 0.0)) {
        fVar15 = ABS(d1 * fVar14 + -(N1.x * fVar16));
        fVar14 = ABS(N1.x * fVar13 + -((float)local_7f8 * fVar14));
        bb_1 = fVar15;
        if (fVar15 < fVar14) {
          bb_1 = fVar14;
        }
        cc._2_2_ = (ushort)(fVar15 < fVar14);
        if (bb_1 < ABS((float)local_7f8 * fVar16 + -(d1 * fVar13))) {
          cc._2_2_ = 2;
        }
        fVar14 = (&pPVar12->x)[(short)cc._2_2_];
        c = (&pPVar11->x)[(short)cc._2_2_];
        fVar15 = (&pPVar10->x)[(short)cc._2_2_];
        fVar16 = (&pPVar6->x)[(short)cc._2_2_];
        f = (&pPVar7->x)[(short)cc._2_2_];
        fVar13 = (&pPVar8->x)[(short)cc._2_2_];
        if (dv2 * dv0dv1 <= 0.0) {
          if (0.0 < dv2 * dv0dv2) {
            x0 = (fVar14 - c) * dv0dv1;
            x1 = (fVar15 - c) * dv0dv1;
            d_1 = dv0dv1 - dv2;
            e = dv0dv1 - dv0dv2;
          }
          else if (((0.0 < dv0dv1 * dv0dv2) || (dv2 != 0.0)) || (NAN(dv2))) {
            x0 = (c - fVar14) * dv2;
            x1 = (fVar15 - fVar14) * dv2;
            d_1 = dv2 - dv0dv1;
            e = dv2 - dv0dv2;
            c = fVar14;
          }
          else {
            if ((dv0dv1 != 0.0) || (NAN(dv0dv1))) {
              x0 = (fVar14 - c) * dv0dv1;
              x1 = (fVar15 - c) * dv0dv1;
              e = dv0dv1 - dv0dv2;
              dv0dv2 = dv0dv1;
            }
            else {
              if ((dv0dv2 == 0.0) && (!NAN(dv0dv2))) {
                local_78c = CoplanarTriTri((Point *)local_7f8,pPVar12,pPVar11,pPVar10,pPVar6,pPVar7,
                                           pPVar8);
                goto LAB_0028db6b;
              }
              x0 = (fVar14 - fVar15) * dv0dv2;
              x1 = (c - fVar15) * dv0dv2;
              e = dv0dv2 - dv0dv1;
              c = fVar15;
            }
            d_1 = dv0dv2 - dv2;
          }
        }
        else {
          x0 = (fVar14 - fVar15) * dv0dv2;
          x1 = (c - fVar15) * dv0dv2;
          d_1 = dv0dv2 - dv2;
          e = dv0dv2 - dv0dv1;
          c = fVar15;
        }
        if (du2 * du0du1 <= 0.0) {
          if (du2 * du0du2 <= 0.0) {
            if (((0.0 < du0du1 * du0du2) || (du2 != 0.0)) || (NAN(du2))) {
              y0 = (f - fVar16) * du2;
              y1 = (fVar13 - fVar16) * du2;
              xx = du2 - du0du1;
              yy = du2 - du0du2;
              f = fVar16;
            }
            else {
              if ((du0du1 != 0.0) || (NAN(du0du1))) {
                y0 = (fVar16 - f) * du0du1;
                y1 = (fVar13 - f) * du0du1;
                yy = du0du1 - du0du2;
                du0du2 = du0du1;
              }
              else {
                if ((du0du2 == 0.0) && (!NAN(du0du2))) {
                  local_78c = CoplanarTriTri((Point *)local_7f8,pPVar12,pPVar11,pPVar10,pPVar6,
                                             pPVar7,pPVar8);
                  goto LAB_0028db6b;
                }
                y0 = (fVar16 - fVar13) * du0du2;
                y1 = (f - fVar13) * du0du2;
                yy = du0du2 - du0du1;
                f = fVar13;
              }
              xx = du0du2 - du2;
            }
          }
          else {
            y0 = (fVar16 - f) * du0du1;
            y1 = (fVar13 - f) * du0du1;
            xx = du0du1 - du2;
            yy = du0du1 - du0du2;
          }
        }
        else {
          y0 = (fVar16 - fVar13) * du0du2;
          y1 = (f - fVar13) * du0du2;
          xx = du0du2 - du2;
          yy = du0du2 - du0du1;
          f = fVar13;
        }
        fVar14 = d_1 * e;
        fVar15 = xx * yy;
        fVar16 = c * fVar14 * fVar15;
        fVar13 = x0 * e * fVar15 + fVar16;
        isect2[1] = x1 * d_1 * fVar15 + fVar16;
        fVar15 = f * fVar14 * fVar15;
        fVar16 = y0 * fVar14 * yy + fVar15;
        tmp_9 = y1 * fVar14 * xx + fVar15;
        isect2[0] = fVar13;
        if (isect2[1] < fVar13) {
          isect2[0] = isect2[1];
          isect2[1] = fVar13;
        }
        c_1 = fVar16;
        if (tmp_9 < fVar16) {
          c_1 = tmp_9;
          tmp_9 = fVar16;
        }
        if ((isect2[1] < c_1) || (tmp_9 < isect2[0])) {
          local_78c = 0;
        }
        else {
          local_78c = 1;
        }
      }
      else {
        local_78c = 0;
      }
    }
    else {
      local_78c = 0;
    }
LAB_0028db6b:
    if (local_78c != 0) {
      pCVar9 = &this->mPairs;
      if ((this->mPairs).mCurNbEntries == pCVar9->mMaxNbEntries) {
        IceCore::Container::Resize(pCVar9,1);
      }
      uVar1 = (this->mPairs).mCurNbEntries;
      (this->mPairs).mCurNbEntries = uVar1 + 1;
      (this->mPairs).mEntries[uVar1] = uVar4;
      uVar4 = this->mLeafIndex;
      if ((this->mPairs).mCurNbEntries == pCVar9->mMaxNbEntries) {
        IceCore::Container::Resize(pCVar9,1);
      }
      uVar1 = (this->mPairs).mCurNbEntries;
      (this->mPairs).mCurNbEntries = uVar1 + 1;
      (this->mPairs).mEntries[uVar1] = uVar4;
      (this->super_Collider).mFlags = (this->super_Collider).mFlags | 4;
    }
  }
  if (((this->super_Collider).mFlags & 5) == 5) {
    return;
  }
  if ((b->mNegData & 1) == 0) {
    _CollideBoxTri(this,(AABBQuantizedNoLeafNode *)b->mNegData);
    return;
  }
  uVar4 = (udword)(b->mNegData >> 1);
  pMVar2 = this->mIMesh0;
  piVar5 = (int *)((long)pMVar2->mTris->mVRef + (ulong)(uVar4 * pMVar2->mTriStride));
  pPVar6 = (Point *)((long)&pMVar2->mVerts->x + (ulong)(*piVar5 * pMVar2->mVertexStride));
  pPVar7 = (Point *)((long)&pMVar2->mVerts->x + (ulong)(piVar5[1] * pMVar2->mVertexStride));
  pPVar8 = (Point *)((long)&pMVar2->mVerts->x + (ulong)(piVar5[2] * pMVar2->mVertexStride));
  pPVar12 = this->mLeafVerts;
  pPVar11 = this->mLeafVerts + 1;
  pPVar10 = this->mLeafVerts + 2;
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar14 = this->mLeafVerts[1].z - this->mLeafVerts[0].z;
  E2_1.y = pPVar11->x - pPVar12->x;
  E2_1.z = this->mLeafVerts[1].y - this->mLeafVerts[0].y;
  fVar15 = this->mLeafVerts[2].z - this->mLeafVerts[0].z;
  local_a78 = pPVar10->x - pPVar12->x;
  fStack_a74 = this->mLeafVerts[2].y - this->mLeafVerts[0].y;
  E2_1.z = SUB84(E2_1._4_8_,4);
  fStack_a74 = SUB84(_local_a78,4);
  local_a90 = (undefined1  [4])(E2_1.z * fVar15 + -(fVar14 * fStack_a74));
  local_a78 = (float)_local_a78;
  E2_1.y = (float)E2_1._4_8_;
  d1_1 = fVar14 * local_a78 + -(E2_1.y * fVar15);
  N1_1.x = E2_1.y * fStack_a74 + -(E2_1.z * local_a78);
  fVar14 = -N1_1.x * this->mLeafVerts[0].z +
           -(float)local_a90 * pPVar12->x + -d1_1 * this->mLeafVerts[0].y;
  du2_1 = N1_1.x * pPVar6->z + (float)local_a90 * pPVar6->x + d1_1 * pPVar6->y + fVar14;
  du0du1_1 = N1_1.x * pPVar7->z + (float)local_a90 * pPVar7->x + d1_1 * pPVar7->y + fVar14;
  du0du2_1 = N1_1.x * pPVar8->z + (float)local_a90 * pPVar8->x + d1_1 * pPVar8->y + fVar14;
  if (ABS(du2_1) < 1e-06) {
    du2_1 = 0.0;
  }
  if (ABS(du0du1_1) < 1e-06) {
    du0du1_1 = 0.0;
  }
  if (ABS(du0du2_1) < 1e-06) {
    du0du2_1 = 0.0;
  }
  if ((du2_1 * du0du1_1 <= 0.0) || (du2_1 * du0du2_1 <= 0.0)) {
    fVar14 = pPVar7->z - pPVar6->z;
    local_ac4 = pPVar7->x - pPVar6->x;
    fStack_ac0 = pPVar7->y - pPVar6->y;
    fVar15 = pPVar8->z - pPVar6->z;
    N2_1.y = pPVar8->x - pPVar6->x;
    N2_1.z = pPVar8->y - pPVar6->y;
    E2_1.z = (float)((ulong)_local_ac4 >> 0x20);
    fStack_a74 = SUB84(N2_1._4_8_,4);
    fVar13 = E2_1.z * fVar15 + -(fVar14 * fStack_a74);
    local_a78 = (float)N2_1._4_8_;
    E2_1.y = (float)_local_ac4;
    fVar16 = fVar14 * local_a78 + -(E2_1.y * fVar15);
    fVar14 = E2_1.y * fStack_a74 + -(E2_1.z * local_a78);
    fVar15 = -fVar14 * pPVar6->z + -fVar13 * pPVar6->x + -fVar16 * pPVar6->y;
    dv2_1 = fVar14 * this->mLeafVerts[0].z + fVar13 * pPVar12->x + fVar16 * this->mLeafVerts[0].y +
            fVar15;
    dv0dv1_1 = fVar14 * this->mLeafVerts[1].z + fVar13 * pPVar11->x + fVar16 * this->mLeafVerts[1].y
               + fVar15;
    dv0dv2_1 = fVar14 * this->mLeafVerts[2].z + fVar13 * pPVar10->x + fVar16 * this->mLeafVerts[2].y
               + fVar15;
    if (ABS(dv2_1) < 1e-06) {
      dv2_1 = 0.0;
    }
    if (ABS(dv0dv1_1) < 1e-06) {
      dv0dv1_1 = 0.0;
    }
    if (ABS(dv0dv2_1) < 1e-06) {
      dv0dv2_1 = 0.0;
    }
    if ((dv2_1 * dv0dv1_1 <= 0.0) || (dv2_1 * dv0dv2_1 <= 0.0)) {
      fVar15 = ABS(d1_1 * fVar14 + -(N1_1.x * fVar16));
      fVar14 = ABS(N1_1.x * fVar13 + -((float)local_a90 * fVar14));
      bb_2 = fVar15;
      if (fVar15 < fVar14) {
        bb_2 = fVar14;
      }
      cc_1._2_2_ = (ushort)(fVar15 < fVar14);
      if (bb_2 < ABS((float)local_a90 * fVar16 + -(d1_1 * fVar13))) {
        cc_1._2_2_ = 2;
      }
      fVar14 = (&pPVar12->x)[(short)cc_1._2_2_];
      c_3 = (&pPVar11->x)[(short)cc_1._2_2_];
      fVar15 = (&pPVar10->x)[(short)cc_1._2_2_];
      fVar16 = (&pPVar6->x)[(short)cc_1._2_2_];
      f_1 = (&pPVar7->x)[(short)cc_1._2_2_];
      fVar13 = (&pPVar8->x)[(short)cc_1._2_2_];
      if (dv2_1 * dv0dv1_1 <= 0.0) {
        if (0.0 < dv2_1 * dv0dv2_1) {
          x0_1 = (fVar14 - c_3) * dv0dv1_1;
          x1_1 = (fVar15 - c_3) * dv0dv1_1;
          d_2 = dv0dv1_1 - dv2_1;
          e_1 = dv0dv1_1 - dv0dv2_1;
        }
        else if (((0.0 < dv0dv1_1 * dv0dv2_1) || (dv2_1 != 0.0)) || (NAN(dv2_1))) {
          x0_1 = (c_3 - fVar14) * dv2_1;
          x1_1 = (fVar15 - fVar14) * dv2_1;
          d_2 = dv2_1 - dv0dv1_1;
          e_1 = dv2_1 - dv0dv2_1;
          c_3 = fVar14;
        }
        else {
          if ((dv0dv1_1 != 0.0) || (NAN(dv0dv1_1))) {
            x0_1 = (fVar14 - c_3) * dv0dv1_1;
            x1_1 = (fVar15 - c_3) * dv0dv1_1;
            e_1 = dv0dv1_1 - dv0dv2_1;
            dv0dv2_1 = dv0dv1_1;
          }
          else {
            if ((dv0dv2_1 == 0.0) && (!NAN(dv0dv2_1))) {
              local_a24 = CoplanarTriTri((Point *)local_a90,pPVar12,pPVar11,pPVar10,pPVar6,pPVar7,
                                         pPVar8);
              goto LAB_0028f82d;
            }
            x0_1 = (fVar14 - fVar15) * dv0dv2_1;
            x1_1 = (c_3 - fVar15) * dv0dv2_1;
            e_1 = dv0dv2_1 - dv0dv1_1;
            c_3 = fVar15;
          }
          d_2 = dv0dv2_1 - dv2_1;
        }
      }
      else {
        x0_1 = (fVar14 - fVar15) * dv0dv2_1;
        x1_1 = (c_3 - fVar15) * dv0dv2_1;
        d_2 = dv0dv2_1 - dv2_1;
        e_1 = dv0dv2_1 - dv0dv1_1;
        c_3 = fVar15;
      }
      if (du2_1 * du0du1_1 <= 0.0) {
        if (du2_1 * du0du2_1 <= 0.0) {
          if (((0.0 < du0du1_1 * du0du2_1) || (du2_1 != 0.0)) || (NAN(du2_1))) {
            y0_1 = (f_1 - fVar16) * du2_1;
            y1_1 = (fVar13 - fVar16) * du2_1;
            xx_1 = du2_1 - du0du1_1;
            yy_1 = du2_1 - du0du2_1;
            f_1 = fVar16;
          }
          else {
            if ((du0du1_1 != 0.0) || (NAN(du0du1_1))) {
              y0_1 = (fVar16 - f_1) * du0du1_1;
              y1_1 = (fVar13 - f_1) * du0du1_1;
              yy_1 = du0du1_1 - du0du2_1;
              du0du2_1 = du0du1_1;
            }
            else {
              if ((du0du2_1 == 0.0) && (!NAN(du0du2_1))) {
                local_a24 = CoplanarTriTri((Point *)local_a90,pPVar12,pPVar11,pPVar10,pPVar6,pPVar7,
                                           pPVar8);
                goto LAB_0028f82d;
              }
              y0_1 = (fVar16 - fVar13) * du0du2_1;
              y1_1 = (f_1 - fVar13) * du0du2_1;
              yy_1 = du0du2_1 - du0du1_1;
              f_1 = fVar13;
            }
            xx_1 = du0du2_1 - du2_1;
          }
        }
        else {
          y0_1 = (fVar16 - f_1) * du0du1_1;
          y1_1 = (fVar13 - f_1) * du0du1_1;
          xx_1 = du0du1_1 - du2_1;
          yy_1 = du0du1_1 - du0du2_1;
        }
      }
      else {
        y0_1 = (fVar16 - fVar13) * du0du2_1;
        y1_1 = (f_1 - fVar13) * du0du2_1;
        xx_1 = du0du2_1 - du2_1;
        yy_1 = du0du2_1 - du0du1_1;
        f_1 = fVar13;
      }
      fVar14 = d_2 * e_1;
      fVar15 = xx_1 * yy_1;
      fVar16 = c_3 * fVar14 * fVar15;
      fVar13 = x0_1 * e_1 * fVar15 + fVar16;
      isect2_1[1] = x1_1 * d_2 * fVar15 + fVar16;
      fVar15 = f_1 * fVar14 * fVar15;
      fVar16 = y0_1 * fVar14 * yy_1 + fVar15;
      tmp_10 = y1_1 * fVar14 * xx_1 + fVar15;
      isect2_1[0] = fVar13;
      if (isect2_1[1] < fVar13) {
        isect2_1[0] = isect2_1[1];
        isect2_1[1] = fVar13;
      }
      c_4 = fVar16;
      if (tmp_10 < fVar16) {
        c_4 = tmp_10;
        tmp_10 = fVar16;
      }
      if ((isect2_1[1] < c_4) || (tmp_10 < isect2_1[0])) {
        local_a24 = 0;
      }
      else {
        local_a24 = 1;
      }
    }
    else {
      local_a24 = 0;
    }
  }
  else {
    local_a24 = 0;
  }
LAB_0028f82d:
  if (local_a24 != 0) {
    pCVar9 = &this->mPairs;
    if ((this->mPairs).mCurNbEntries == pCVar9->mMaxNbEntries) {
      IceCore::Container::Resize(pCVar9,1);
    }
    uVar1 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar1 + 1;
    (this->mPairs).mEntries[uVar1] = uVar4;
    uVar4 = this->mLeafIndex;
    if ((this->mPairs).mCurNbEntries == pCVar9->mMaxNbEntries) {
      IceCore::Container::Resize(pCVar9,1);
    }
    uVar1 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar1 + 1;
    (this->mPairs).mEntries[uVar1] = uVar4;
    (this->super_Collider).mFlags = (this->super_Collider).mFlags | 4;
  }
  return;
}

Assistant:

void AABBTreeCollider::_CollideBoxTri(const AABBQuantizedNoLeafNode* b)
{
	// Dequantize box
	const QuantizedAABB* bb = &b->mAABB;
	const Point Pa(float(bb->mCenter[0]) * mCenterCoeff0.x, float(bb->mCenter[1]) * mCenterCoeff0.y, float(bb->mCenter[2]) * mCenterCoeff0.z);
	const Point ea(float(bb->mExtents[0]) * mExtentsCoeff0.x, float(bb->mExtents[1]) * mExtentsCoeff0.y, float(bb->mExtents[2]) * mExtentsCoeff0.z);

	// Perform triangle-box overlap test
	if(!TriBoxOverlap(Pa, ea))	return;

	if(b->HasPosLeaf())	PrimTestIndexTri(b->GetPosPrimitive());
	else				_CollideBoxTri(b->GetPos());

	if(ContactFound()) return;

	if(b->HasNegLeaf())	PrimTestIndexTri(b->GetNegPrimitive());
	else				_CollideBoxTri(b->GetNeg());
}